

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meow_hash_x64_aesni.h
# Opt level: O0

__m128i MeowHash(void *Seed128Init,unsigned_long_long Len,void *SourceInit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar69;
  ulong uVar70;
  ulong *in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  __m128i alVar81;
  __m128i xmm11;
  __m128i xmm10;
  __m128i xmm9;
  __m128i xmm8;
  __m128i xmm7;
  __m128i xmm6;
  __m128i xmm5;
  __m128i xmm4;
  __m128i xmm3;
  __m128i xmm2;
  __m128i xmm1;
  __m128i xmm0;
  uint local_21f4;
  ulong local_21d0;
  ulong *local_21c0;
  undefined1 local_21a8 [16];
  undefined1 local_2188 [16];
  ulong local_2178;
  ulong uStack_2170;
  undefined1 local_2158 [16];
  undefined1 local_2138 [16];
  undefined1 local_2128 [16];
  undefined1 local_2118 [16];
  undefined1 local_2108 [16];
  undefined1 local_20f8 [16];
  undefined1 local_20e8 [16];
  undefined1 local_20d8 [16];
  undefined1 local_20c8 [16];
  uint LaneCount;
  int Align;
  uchar *LastOk;
  uint Len8;
  uchar *Last;
  unsigned_long_long BlockCount;
  uchar *rcx;
  uchar *rax;
  __m128i xmm15;
  __m128i xmm14;
  __m128i xmm13;
  __m128i xmm12;
  
  local_20c8._0_8_ = *in_RDI;
  local_20c8._8_8_ = in_RDI[1];
  local_20d8 = *(undefined1 (*) [16])(in_RDI + 2);
  local_20e8 = *(undefined1 (*) [16])(in_RDI + 4);
  local_20f8 = *(undefined1 (*) [16])(in_RDI + 6);
  local_2108 = *(undefined1 (*) [16])(in_RDI + 8);
  local_2118 = *(undefined1 (*) [16])(in_RDI + 10);
  local_2128 = *(undefined1 (*) [16])(in_RDI + 0xc);
  local_2138 = *(undefined1 (*) [16])(in_RDI + 0xe);
  local_21d0 = in_RSI >> 8;
  local_21c0 = in_RDX;
  if (local_21d0 < 0x400) {
    while (local_21d0 != 0) {
      auVar49._8_8_ = local_20c8._8_8_;
      auVar49._0_8_ = local_20c8._0_8_;
      auVar71 = aesdec(auVar49,local_2108);
      auVar1 = vpaddq_avx(local_2128,*(undefined1 (*) [16])((long)local_21c0 + 0xf));
      auVar48._8_8_ = local_2108._8_8_ ^ local_21c0[1];
      auVar48._0_8_ = local_2108._0_8_ ^ *local_21c0;
      auVar72 = aesdec(auVar48,local_20d8);
      auVar78 = vpaddq_avx(local_20e8,*(undefined1 (*) [16])((long)local_21c0 + 1));
      auVar79._8_8_ = local_20d8._8_8_ ^ local_21c0[3];
      auVar79._0_8_ = local_20d8._0_8_ ^ local_21c0[2];
      auVar73 = aesdec(auVar79,local_2118);
      auVar79 = vpaddq_avx(local_2138,*(undefined1 (*) [16])((long)local_21c0 + 0x2f));
      local_20e8._0_8_ = auVar78._0_8_;
      local_20e8._8_8_ = auVar78._8_8_;
      auVar47._8_8_ = local_2118._8_8_ ^ local_21c0[5];
      auVar47._0_8_ = local_2118._0_8_ ^ local_21c0[4];
      auVar74 = aesdec(auVar47,auVar78);
      auVar78 = vpaddq_avx(local_20f8,*(undefined1 (*) [16])((long)local_21c0 + 0x21));
      local_2128._0_8_ = auVar1._0_8_;
      local_2128._8_8_ = auVar1._8_8_;
      auVar46._8_8_ = local_20e8._8_8_ ^ local_21c0[7];
      auVar46._0_8_ = local_20e8._0_8_ ^ local_21c0[6];
      auVar75 = aesdec(auVar46,auVar1);
      auVar1 = vpaddq_avx(auVar71,*(undefined1 (*) [16])((long)local_21c0 + 0x4f));
      local_20f8._0_8_ = auVar78._0_8_;
      local_20f8._8_8_ = auVar78._8_8_;
      auVar45._8_8_ = local_2128._8_8_ ^ local_21c0[9];
      auVar45._0_8_ = local_2128._0_8_ ^ local_21c0[8];
      auVar71 = aesdec(auVar45,auVar78);
      auVar78 = vpaddq_avx(auVar72,*(undefined1 (*) [16])((long)local_21c0 + 0x41));
      local_2138._0_8_ = auVar79._0_8_;
      local_2138._8_8_ = auVar79._8_8_;
      auVar44._8_8_ = local_20f8._8_8_ ^ local_21c0[0xb];
      auVar44._0_8_ = local_20f8._0_8_ ^ local_21c0[10];
      auVar72 = aesdec(auVar44,auVar79);
      auVar79 = vpaddq_avx(auVar73,*(undefined1 (*) [16])((long)local_21c0 + 0x6f));
      local_2108._0_8_ = auVar78._0_8_;
      local_2108._8_8_ = auVar78._8_8_;
      auVar76._8_8_ = local_2138._8_8_ ^ local_21c0[0xd];
      auVar76._0_8_ = local_2138._0_8_ ^ local_21c0[0xc];
      auVar76 = aesdec(auVar76,auVar78);
      auVar78 = vpaddq_avx(auVar74,*(undefined1 (*) [16])((long)local_21c0 + 0x61));
      local_20c8._0_8_ = auVar1._0_8_;
      local_20c8._8_8_ = auVar1._8_8_;
      auVar80._8_8_ = local_2108._8_8_ ^ local_21c0[0xf];
      auVar80._0_8_ = local_2108._0_8_ ^ local_21c0[0xe];
      auVar80 = aesdec(auVar80,auVar1);
      auVar1 = vpaddq_avx(auVar75,*(undefined1 (*) [16])((long)local_21c0 + 0x8f));
      local_2118._0_8_ = auVar78._0_8_;
      local_2118._8_8_ = auVar78._8_8_;
      auVar75._8_8_ = local_20c8._8_8_ ^ local_21c0[0x11];
      auVar75._0_8_ = local_20c8._0_8_ ^ local_21c0[0x10];
      auVar75 = aesdec(auVar75,auVar78);
      auVar78 = vpaddq_avx(auVar71,*(undefined1 (*) [16])((long)local_21c0 + 0x81));
      local_20d8._0_8_ = auVar79._0_8_;
      local_20d8._8_8_ = auVar79._8_8_;
      auVar74._8_8_ = local_2118._8_8_ ^ local_21c0[0x13];
      auVar74._0_8_ = local_2118._0_8_ ^ local_21c0[0x12];
      auVar74 = aesdec(auVar74,auVar79);
      auVar79 = vpaddq_avx(auVar72,*(undefined1 (*) [16])((long)local_21c0 + 0xaf));
      local_2128._0_8_ = auVar78._0_8_;
      local_2128._8_8_ = auVar78._8_8_;
      auVar73._8_8_ = local_20d8._8_8_ ^ local_21c0[0x15];
      auVar73._0_8_ = local_20d8._0_8_ ^ local_21c0[0x14];
      auVar73 = aesdec(auVar73,auVar78);
      auVar78 = vpaddq_avx(auVar76,*(undefined1 (*) [16])((long)local_21c0 + 0xa1));
      local_20e8._0_8_ = auVar1._0_8_;
      local_20e8._8_8_ = auVar1._8_8_;
      auVar72._8_8_ = local_2128._8_8_ ^ local_21c0[0x17];
      auVar72._0_8_ = local_2128._0_8_ ^ local_21c0[0x16];
      local_2128 = aesdec(auVar72,auVar1);
      local_2108 = vpaddq_avx(auVar80,*(undefined1 (*) [16])((long)local_21c0 + 0xcf));
      local_2138._0_8_ = auVar78._0_8_;
      local_2138._8_8_ = auVar78._8_8_;
      auVar1._8_8_ = local_20e8._8_8_ ^ local_21c0[0x19];
      auVar1._0_8_ = local_20e8._0_8_ ^ local_21c0[0x18];
      local_20e8 = aesdec(auVar1,auVar78);
      auVar1 = vpaddq_avx(auVar75,*(undefined1 (*) [16])((long)local_21c0 + 0xc1));
      local_20f8._0_8_ = auVar79._0_8_;
      local_20f8._8_8_ = auVar79._8_8_;
      auVar71._8_8_ = local_2138._8_8_ ^ local_21c0[0x1b];
      auVar71._0_8_ = local_2138._0_8_ ^ local_21c0[0x1a];
      local_2138 = aesdec(auVar71,auVar79);
      local_2118 = vpaddq_avx(auVar74,*(undefined1 (*) [16])((long)local_21c0 + 0xef));
      local_20c8._0_8_ = auVar1._0_8_;
      local_20c8._8_8_ = auVar1._8_8_;
      auVar78._8_8_ = local_20f8._8_8_ ^ local_21c0[0x1d];
      auVar78._0_8_ = local_20f8._0_8_ ^ local_21c0[0x1c];
      local_20f8 = aesdec(auVar78,auVar1);
      local_20d8 = vpaddq_avx(auVar73,*(undefined1 (*) [16])((long)local_21c0 + 0xe1));
      local_20c8._0_8_ = local_20c8._0_8_ ^ local_21c0[0x1e];
      local_20c8._8_8_ = local_20c8._8_8_ ^ local_21c0[0x1f];
      local_21c0 = local_21c0 + 0x20;
      local_21d0 = local_21d0 - 1;
    }
  }
  else {
    while (local_21d0 != 0) {
      auVar65._8_8_ = local_20c8._8_8_;
      auVar65._0_8_ = local_20c8._0_8_;
      auVar71 = aesdec(auVar65,local_2108);
      auVar1 = vpaddq_avx(local_2128,*(undefined1 (*) [16])((long)local_21c0 + 0xf));
      auVar64._8_8_ = local_2108._8_8_ ^ local_21c0[1];
      auVar64._0_8_ = local_2108._0_8_ ^ *local_21c0;
      auVar72 = aesdec(auVar64,local_20d8);
      auVar78 = vpaddq_avx(local_20e8,*(undefined1 (*) [16])((long)local_21c0 + 1));
      auVar63._8_8_ = local_20d8._8_8_ ^ local_21c0[3];
      auVar63._0_8_ = local_20d8._0_8_ ^ local_21c0[2];
      auVar73 = aesdec(auVar63,local_2118);
      auVar79 = vpaddq_avx(local_2138,*(undefined1 (*) [16])((long)local_21c0 + 0x2f));
      local_20e8._0_8_ = auVar78._0_8_;
      local_20e8._8_8_ = auVar78._8_8_;
      auVar62._8_8_ = local_2118._8_8_ ^ local_21c0[5];
      auVar62._0_8_ = local_2118._0_8_ ^ local_21c0[4];
      auVar74 = aesdec(auVar62,auVar78);
      auVar78 = vpaddq_avx(local_20f8,*(undefined1 (*) [16])((long)local_21c0 + 0x21));
      local_2128._0_8_ = auVar1._0_8_;
      local_2128._8_8_ = auVar1._8_8_;
      auVar61._8_8_ = local_20e8._8_8_ ^ local_21c0[7];
      auVar61._0_8_ = local_20e8._0_8_ ^ local_21c0[6];
      auVar75 = aesdec(auVar61,auVar1);
      auVar1 = vpaddq_avx(auVar71,*(undefined1 (*) [16])((long)local_21c0 + 0x4f));
      local_20f8._0_8_ = auVar78._0_8_;
      local_20f8._8_8_ = auVar78._8_8_;
      auVar60._8_8_ = local_2128._8_8_ ^ local_21c0[9];
      auVar60._0_8_ = local_2128._0_8_ ^ local_21c0[8];
      auVar71 = aesdec(auVar60,auVar78);
      auVar78 = vpaddq_avx(auVar72,*(undefined1 (*) [16])((long)local_21c0 + 0x41));
      local_2138._0_8_ = auVar79._0_8_;
      local_2138._8_8_ = auVar79._8_8_;
      auVar59._8_8_ = local_20f8._8_8_ ^ local_21c0[0xb];
      auVar59._0_8_ = local_20f8._0_8_ ^ local_21c0[10];
      auVar72 = aesdec(auVar59,auVar79);
      auVar79 = vpaddq_avx(auVar73,*(undefined1 (*) [16])((long)local_21c0 + 0x6f));
      local_2108._0_8_ = auVar78._0_8_;
      local_2108._8_8_ = auVar78._8_8_;
      auVar58._8_8_ = local_2138._8_8_ ^ local_21c0[0xd];
      auVar58._0_8_ = local_2138._0_8_ ^ local_21c0[0xc];
      auVar73 = aesdec(auVar58,auVar78);
      auVar78 = vpaddq_avx(auVar74,*(undefined1 (*) [16])((long)local_21c0 + 0x61));
      local_20c8._0_8_ = auVar1._0_8_;
      local_20c8._8_8_ = auVar1._8_8_;
      auVar57._8_8_ = local_2108._8_8_ ^ local_21c0[0xf];
      auVar57._0_8_ = local_2108._0_8_ ^ local_21c0[0xe];
      auVar74 = aesdec(auVar57,auVar1);
      auVar1 = vpaddq_avx(auVar75,*(undefined1 (*) [16])((long)local_21c0 + 0x8f));
      local_2118._0_8_ = auVar78._0_8_;
      local_2118._8_8_ = auVar78._8_8_;
      auVar56._8_8_ = local_20c8._8_8_ ^ local_21c0[0x11];
      auVar56._0_8_ = local_20c8._0_8_ ^ local_21c0[0x10];
      auVar75 = aesdec(auVar56,auVar78);
      auVar78 = vpaddq_avx(auVar71,*(undefined1 (*) [16])((long)local_21c0 + 0x81));
      local_20d8._0_8_ = auVar79._0_8_;
      local_20d8._8_8_ = auVar79._8_8_;
      auVar55._8_8_ = local_2118._8_8_ ^ local_21c0[0x13];
      auVar55._0_8_ = local_2118._0_8_ ^ local_21c0[0x12];
      auVar71 = aesdec(auVar55,auVar79);
      auVar79 = vpaddq_avx(auVar72,*(undefined1 (*) [16])((long)local_21c0 + 0xaf));
      local_2128._0_8_ = auVar78._0_8_;
      local_2128._8_8_ = auVar78._8_8_;
      auVar54._8_8_ = local_20d8._8_8_ ^ local_21c0[0x15];
      auVar54._0_8_ = local_20d8._0_8_ ^ local_21c0[0x14];
      auVar72 = aesdec(auVar54,auVar78);
      auVar78 = vpaddq_avx(auVar73,*(undefined1 (*) [16])((long)local_21c0 + 0xa1));
      local_20e8._0_8_ = auVar1._0_8_;
      local_20e8._8_8_ = auVar1._8_8_;
      auVar53._8_8_ = local_2128._8_8_ ^ local_21c0[0x17];
      auVar53._0_8_ = local_2128._0_8_ ^ local_21c0[0x16];
      local_2128 = aesdec(auVar53,auVar1);
      local_2108 = vpaddq_avx(auVar74,*(undefined1 (*) [16])((long)local_21c0 + 0xcf));
      local_2138._0_8_ = auVar78._0_8_;
      local_2138._8_8_ = auVar78._8_8_;
      auVar52._8_8_ = local_20e8._8_8_ ^ local_21c0[0x19];
      auVar52._0_8_ = local_20e8._0_8_ ^ local_21c0[0x18];
      local_20e8 = aesdec(auVar52,auVar78);
      auVar1 = vpaddq_avx(auVar75,*(undefined1 (*) [16])((long)local_21c0 + 0xc1));
      local_20f8._0_8_ = auVar79._0_8_;
      local_20f8._8_8_ = auVar79._8_8_;
      auVar51._8_8_ = local_2138._8_8_ ^ local_21c0[0x1b];
      auVar51._0_8_ = local_2138._0_8_ ^ local_21c0[0x1a];
      local_2138 = aesdec(auVar51,auVar79);
      local_2118 = vpaddq_avx(auVar71,*(undefined1 (*) [16])((long)local_21c0 + 0xef));
      local_20c8._0_8_ = auVar1._0_8_;
      local_20c8._8_8_ = auVar1._8_8_;
      auVar50._8_8_ = local_20f8._8_8_ ^ local_21c0[0x1d];
      auVar50._0_8_ = local_20f8._0_8_ ^ local_21c0[0x1c];
      local_20f8 = aesdec(auVar50,auVar1);
      local_20d8 = vpaddq_avx(auVar72,*(undefined1 (*) [16])((long)local_21c0 + 0xe1));
      local_20c8._0_8_ = local_20c8._0_8_ ^ local_21c0[0x1e];
      local_20c8._8_8_ = local_20c8._8_8_ ^ local_21c0[0x1f];
      local_21c0 = local_21c0 + 0x20;
      local_21d0 = local_21d0 - 1;
    }
  }
  local_2158 = ZEXT816(0);
  local_2178 = 0;
  uStack_2170 = 0;
  uVar70 = (long)in_RDX + (in_RSI & 0xfffffffffffffff0);
  if ((in_RSI & 0xf) != 0) {
    if (((long)in_RDX + (in_RSI - 1) | 0xfff) - 0x10 < uVar70) {
      local_21f4 = (uint)uVar70 & 0xf;
    }
    else {
      local_21f4 = 0;
    }
    in_RDX = (ulong *)(long)(int)local_21f4;
    auVar1 = vpshufb_avx(*(undefined1 (*) [16])(uVar70 - (long)in_RDX),
                         *(undefined1 (*) [16])(MeowShiftAdjust + (int)local_21f4));
    local_2158 = vpand_avx(auVar1,*(undefined1 (*) [16])
                                   (MeowMaskLen + (0x10 - ((uint)in_RSI & 0xf))));
  }
  if ((in_RSI & 0x10) != 0) {
    local_2178 = local_2158._0_8_;
    uStack_2170 = local_2158._8_8_;
    local_2158 = *(undefined1 (*) [16])(uVar70 - 0x10);
  }
  auVar2._8_8_ = uStack_2170;
  auVar2._0_8_ = local_2178;
  auVar1 = vpalignr_avx(local_2158,auVar2,0xf);
  auVar3._8_8_ = uStack_2170;
  auVar3._0_8_ = local_2178;
  auVar78 = vpalignr_avx(local_2158,auVar3,1);
  local_2188 = ZEXT816(0);
  local_21a8 = ZEXT816(0);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = in_RSI;
  auVar71 = vpunpcklqdq_avx(auVar77,ZEXT816(0));
  xmm14[1] = auVar71._0_8_;
  xmm13[0] = auVar71._8_8_;
  auVar79 = vpalignr_avx(local_2188,auVar71,0xf);
  auVar71 = vpalignr_avx(local_21a8,auVar71,1);
  auVar43._8_8_ = local_20c8._8_8_;
  auVar43._0_8_ = local_20c8._0_8_;
  local_20c8 = aesdec(auVar43,local_2108);
  local_2128 = vpaddq_avx(local_2128,auVar1);
  auVar42._8_8_ = local_2108._8_8_ ^ local_2158._8_8_;
  auVar42._0_8_ = local_2108._0_8_ ^ local_2158._0_8_;
  local_2108 = aesdec(auVar42,local_20d8);
  auVar1 = vpaddq_avx(local_20e8,auVar78);
  auVar41._8_8_ = local_20d8._8_8_ ^ uStack_2170;
  auVar41._0_8_ = local_20d8._0_8_ ^ local_2178;
  local_20d8 = aesdec(auVar41,local_2118);
  local_2138 = vpaddq_avx(local_2138,auVar79);
  local_20e8._0_8_ = auVar1._0_8_;
  local_20e8._8_8_ = auVar1._8_8_;
  local_2118 = aesdec(local_2118,auVar1);
  local_20f8 = vpaddq_avx(local_20f8,auVar71);
  local_20e8._0_8_ = local_20e8._0_8_ ^ xmm14[1];
  local_20e8._8_8_ = local_20e8._8_8_ ^ xmm13[0];
  uVar70 = in_RSI >> 5 & 7;
  iVar69 = (int)uVar70;
  if (iVar69 != 0) {
    auVar40._8_8_ = local_20e8._8_8_;
    auVar40._0_8_ = local_20e8._0_8_;
    local_20e8 = aesdec(auVar40,local_2128);
    local_20c8 = vpaddq_avx(local_20c8,*(undefined1 (*) [16])((long)local_21c0 + 0xf));
    auVar39._8_8_ = local_2128._8_8_ ^ local_21c0[1];
    auVar39._0_8_ = local_2128._0_8_ ^ *local_21c0;
    local_2128 = aesdec(auVar39,local_20f8);
    local_2108 = vpaddq_avx(local_2108,*(undefined1 (*) [16])((long)local_21c0 + 1));
    local_20f8._0_8_ = local_20f8._0_8_ ^ local_21c0[2];
    local_20f8._8_8_ = local_20f8._8_8_ ^ local_21c0[3];
    uVar70 = (ulong)(iVar69 - 1U);
    if (iVar69 - 1U != 0) {
      auVar38._8_8_ = local_20f8._8_8_;
      auVar38._0_8_ = local_20f8._0_8_;
      local_20f8 = aesdec(auVar38,local_2138);
      local_20d8 = vpaddq_avx(local_20d8,*(undefined1 (*) [16])((long)local_21c0 + 0x2f));
      auVar37._8_8_ = local_2138._8_8_ ^ local_21c0[5];
      auVar37._0_8_ = local_2138._0_8_ ^ local_21c0[4];
      local_2138 = aesdec(auVar37,local_2108);
      local_2118 = vpaddq_avx(local_2118,*(undefined1 (*) [16])((long)local_21c0 + 0x21));
      local_2108._0_8_ = local_2108._0_8_ ^ local_21c0[6];
      local_2108._8_8_ = local_2108._8_8_ ^ local_21c0[7];
      uVar70 = (ulong)(iVar69 - 2U);
      if (iVar69 - 2U != 0) {
        auVar36._8_8_ = local_2108._8_8_;
        auVar36._0_8_ = local_2108._0_8_;
        local_2108 = aesdec(auVar36,local_20c8);
        local_20e8 = vpaddq_avx(local_20e8,*(undefined1 (*) [16])((long)local_21c0 + 0x4f));
        auVar35._8_8_ = local_20c8._8_8_ ^ local_21c0[9];
        auVar35._0_8_ = local_20c8._0_8_ ^ local_21c0[8];
        local_20c8 = aesdec(auVar35,local_2118);
        local_2128 = vpaddq_avx(local_2128,*(undefined1 (*) [16])((long)local_21c0 + 0x41));
        local_2118._0_8_ = local_2118._0_8_ ^ local_21c0[10];
        local_2118._8_8_ = local_2118._8_8_ ^ local_21c0[0xb];
        uVar70 = (ulong)(iVar69 - 3U);
        if (iVar69 - 3U != 0) {
          auVar34._8_8_ = local_2118._8_8_;
          auVar34._0_8_ = local_2118._0_8_;
          local_2118 = aesdec(auVar34,local_20d8);
          local_20f8 = vpaddq_avx(local_20f8,*(undefined1 (*) [16])((long)local_21c0 + 0x6f));
          auVar33._8_8_ = local_20d8._8_8_ ^ local_21c0[0xd];
          auVar33._0_8_ = local_20d8._0_8_ ^ local_21c0[0xc];
          local_20d8 = aesdec(auVar33,local_2128);
          local_2138 = vpaddq_avx(local_2138,*(undefined1 (*) [16])((long)local_21c0 + 0x61));
          local_2128._0_8_ = local_2128._0_8_ ^ local_21c0[0xe];
          local_2128._8_8_ = local_2128._8_8_ ^ local_21c0[0xf];
          uVar70 = (ulong)(iVar69 - 4U);
          if (iVar69 - 4U != 0) {
            auVar32._8_8_ = local_2128._8_8_;
            auVar32._0_8_ = local_2128._0_8_;
            local_2128 = aesdec(auVar32,local_20e8);
            local_2108 = vpaddq_avx(local_2108,*(undefined1 (*) [16])((long)local_21c0 + 0x8f));
            auVar31._8_8_ = local_20e8._8_8_ ^ local_21c0[0x11];
            auVar31._0_8_ = local_20e8._0_8_ ^ local_21c0[0x10];
            local_20e8 = aesdec(auVar31,local_2138);
            local_20c8 = vpaddq_avx(local_20c8,*(undefined1 (*) [16])((long)local_21c0 + 0x81));
            local_2138._0_8_ = local_2138._0_8_ ^ local_21c0[0x12];
            local_2138._8_8_ = local_2138._8_8_ ^ local_21c0[0x13];
            uVar70 = (ulong)(iVar69 - 5U);
            if (iVar69 - 5U != 0) {
              auVar30._8_8_ = local_2138._8_8_;
              auVar30._0_8_ = local_2138._0_8_;
              local_2138 = aesdec(auVar30,local_20f8);
              local_2118 = vpaddq_avx(local_2118,*(undefined1 (*) [16])((long)local_21c0 + 0xaf));
              auVar29._8_8_ = local_20f8._8_8_ ^ local_21c0[0x15];
              auVar29._0_8_ = local_20f8._0_8_ ^ local_21c0[0x14];
              local_20f8 = aesdec(auVar29,local_20c8);
              local_20d8 = vpaddq_avx(local_20d8,*(undefined1 (*) [16])((long)local_21c0 + 0xa1));
              local_20c8._0_8_ = local_20c8._0_8_ ^ local_21c0[0x16];
              local_20c8._8_8_ = local_20c8._8_8_ ^ local_21c0[0x17];
              uVar70 = (ulong)(iVar69 - 6U);
              if (iVar69 - 6U != 0) {
                auVar28._8_8_ = local_20c8._8_8_;
                auVar28._0_8_ = local_20c8._0_8_;
                local_20c8 = aesdec(auVar28,local_2108);
                local_2128 = vpaddq_avx(local_2128,*(undefined1 (*) [16])((long)local_21c0 + 0xcf));
                auVar27._8_8_ = local_2108._8_8_ ^ local_21c0[0x19];
                auVar27._0_8_ = local_2108._0_8_ ^ local_21c0[0x18];
                local_2108 = aesdec(auVar27,local_20d8);
                local_20e8 = vpaddq_avx(local_20e8,*(undefined1 (*) [16])((long)local_21c0 + 0xc1));
                local_20d8._8_8_ = local_20d8._8_8_ ^ local_21c0[0x1b];
                local_20d8._0_8_ = local_20d8._0_8_ ^ local_21c0[0x1a];
                uVar70 = (ulong)(iVar69 - 7);
              }
            }
          }
        }
      }
    }
  }
  auVar78 = aesdec(local_20c8,local_2108);
  auVar1 = vpaddq_avx(local_20d8,local_2118);
  local_20d8._0_8_ = auVar1._0_8_;
  local_20d8._8_8_ = auVar1._8_8_;
  auVar26._8_8_ = local_2108._8_8_ ^ local_2128._8_8_;
  auVar26._0_8_ = local_2108._0_8_ ^ local_2128._0_8_;
  auVar79 = aesdec(auVar26,auVar1);
  auVar1 = vpaddq_avx(local_2118,local_2128);
  local_2118._0_8_ = auVar1._0_8_;
  local_2118._8_8_ = auVar1._8_8_;
  auVar25._8_8_ = local_20d8._8_8_ ^ local_20e8._8_8_;
  auVar25._0_8_ = local_20d8._0_8_ ^ local_20e8._0_8_;
  auVar71 = aesdec(auVar25,auVar1);
  auVar1 = vpaddq_avx(local_20e8,local_2128);
  local_20e8._0_8_ = auVar1._0_8_;
  local_20e8._8_8_ = auVar1._8_8_;
  auVar24._8_8_ = local_2118._8_8_ ^ local_2138._8_8_;
  auVar24._0_8_ = local_2118._0_8_ ^ local_2138._0_8_;
  auVar72 = aesdec(auVar24,auVar1);
  auVar1 = vpaddq_avx(local_2128,local_2138);
  local_2128._0_8_ = auVar1._0_8_;
  local_2128._8_8_ = auVar1._8_8_;
  auVar23._8_8_ = local_20e8._8_8_ ^ local_20f8._8_8_;
  auVar23._0_8_ = local_20e8._0_8_ ^ local_20f8._0_8_;
  auVar73 = aesdec(auVar23,auVar1);
  auVar1 = vpaddq_avx(local_20f8,local_2138);
  local_20c8._0_8_ = auVar78._0_8_;
  local_20c8._8_8_ = auVar78._8_8_;
  local_20f8._0_8_ = auVar1._0_8_;
  local_20f8._8_8_ = auVar1._8_8_;
  auVar22._8_8_ = local_2128._8_8_ ^ local_20c8._8_8_;
  auVar22._0_8_ = local_2128._0_8_ ^ local_20c8._0_8_;
  auVar74 = aesdec(auVar22,auVar1);
  auVar1 = vpaddq_avx(local_2138,auVar78);
  local_2108._0_8_ = auVar79._0_8_;
  local_2108._8_8_ = auVar79._8_8_;
  local_2138._0_8_ = auVar1._0_8_;
  local_2138._8_8_ = auVar1._8_8_;
  auVar21._8_8_ = local_20f8._8_8_ ^ local_2108._8_8_;
  auVar21._0_8_ = local_20f8._0_8_ ^ local_2108._0_8_;
  auVar75 = aesdec(auVar21,auVar1);
  auVar1 = vpaddq_avx(auVar79,auVar78);
  local_20d8._0_8_ = auVar71._0_8_;
  local_20d8._8_8_ = auVar71._8_8_;
  local_2108._0_8_ = auVar1._0_8_;
  local_2108._8_8_ = auVar1._8_8_;
  auVar20._8_8_ = local_2138._8_8_ ^ local_20d8._8_8_;
  auVar20._0_8_ = local_2138._0_8_ ^ local_20d8._0_8_;
  auVar79 = aesdec(auVar20,auVar1);
  auVar1 = vpaddq_avx(auVar78,auVar71);
  local_2118._0_8_ = auVar72._0_8_;
  local_2118._8_8_ = auVar72._8_8_;
  local_20c8._0_8_ = auVar1._0_8_;
  local_20c8._8_8_ = auVar1._8_8_;
  auVar19._8_8_ = local_2108._8_8_ ^ local_2118._8_8_;
  auVar19._0_8_ = local_2108._0_8_ ^ local_2118._0_8_;
  auVar78 = aesdec(auVar19,auVar1);
  auVar1 = vpaddq_avx(auVar72,auVar71);
  local_20e8._0_8_ = auVar73._0_8_;
  local_20e8._8_8_ = auVar73._8_8_;
  local_2118._0_8_ = auVar1._0_8_;
  local_2118._8_8_ = auVar1._8_8_;
  auVar18._8_8_ = local_20c8._8_8_ ^ local_20e8._8_8_;
  auVar18._0_8_ = local_20c8._0_8_ ^ local_20e8._0_8_;
  auVar72 = aesdec(auVar18,auVar1);
  auVar1 = vpaddq_avx(auVar71,auVar73);
  local_2128._0_8_ = auVar74._0_8_;
  local_2128._8_8_ = auVar74._8_8_;
  local_20d8._0_8_ = auVar1._0_8_;
  local_20d8._8_8_ = auVar1._8_8_;
  auVar17._8_8_ = local_2118._8_8_ ^ local_2128._8_8_;
  auVar17._0_8_ = local_2118._0_8_ ^ local_2128._0_8_;
  auVar71 = aesdec(auVar17,auVar1);
  auVar1 = vpaddq_avx(auVar74,auVar73);
  local_20f8._0_8_ = auVar75._0_8_;
  local_20f8._8_8_ = auVar75._8_8_;
  local_2128._0_8_ = auVar1._0_8_;
  local_2128._8_8_ = auVar1._8_8_;
  auVar16._8_8_ = local_20d8._8_8_ ^ local_20f8._8_8_;
  auVar16._0_8_ = local_20d8._0_8_ ^ local_20f8._0_8_;
  auVar74 = aesdec(auVar16,auVar1);
  auVar1 = vpaddq_avx(auVar73,auVar75);
  local_2138._0_8_ = auVar79._0_8_;
  local_2138._8_8_ = auVar79._8_8_;
  local_20e8._0_8_ = auVar1._0_8_;
  local_20e8._8_8_ = auVar1._8_8_;
  auVar15._8_8_ = local_2128._8_8_ ^ local_2138._8_8_;
  auVar15._0_8_ = local_2128._0_8_ ^ local_2138._0_8_;
  auVar73 = aesdec(auVar15,auVar1);
  auVar1 = vpaddq_avx(auVar79,auVar75);
  local_2108._0_8_ = auVar78._0_8_;
  local_2108._8_8_ = auVar78._8_8_;
  local_2138._0_8_ = auVar1._0_8_;
  local_2138._8_8_ = auVar1._8_8_;
  auVar14._8_8_ = local_20e8._8_8_ ^ local_2108._8_8_;
  auVar14._0_8_ = local_20e8._0_8_ ^ local_2108._0_8_;
  auVar79 = aesdec(auVar14,auVar1);
  auVar1 = vpaddq_avx(auVar75,auVar78);
  local_20c8._0_8_ = auVar72._0_8_;
  local_20c8._8_8_ = auVar72._8_8_;
  local_20f8._0_8_ = auVar1._0_8_;
  local_20f8._8_8_ = auVar1._8_8_;
  auVar13._8_8_ = local_2138._8_8_ ^ local_20c8._8_8_;
  auVar13._0_8_ = local_2138._0_8_ ^ local_20c8._0_8_;
  auVar75 = aesdec(auVar13,auVar1);
  auVar1 = vpaddq_avx(auVar72,auVar78);
  local_2118._0_8_ = auVar71._0_8_;
  local_2118._8_8_ = auVar71._8_8_;
  local_20c8._0_8_ = auVar1._0_8_;
  local_20c8._8_8_ = auVar1._8_8_;
  auVar12._8_8_ = local_20f8._8_8_ ^ local_2118._8_8_;
  auVar12._0_8_ = local_20f8._0_8_ ^ local_2118._0_8_;
  auVar72 = aesdec(auVar12,auVar1);
  auVar1 = vpaddq_avx(auVar78,auVar71);
  local_20d8._0_8_ = auVar74._0_8_;
  local_20d8._8_8_ = auVar74._8_8_;
  local_2108._0_8_ = auVar1._0_8_;
  local_2108._8_8_ = auVar1._8_8_;
  auVar11._8_8_ = local_20c8._8_8_ ^ local_20d8._8_8_;
  auVar11._0_8_ = local_20c8._0_8_ ^ local_20d8._0_8_;
  auVar78 = aesdec(auVar11,auVar1);
  auVar1 = vpaddq_avx(auVar74,auVar71);
  local_2128._0_8_ = auVar73._0_8_;
  local_2128._8_8_ = auVar73._8_8_;
  local_20d8._0_8_ = auVar1._0_8_;
  local_20d8._8_8_ = auVar1._8_8_;
  auVar10._8_8_ = local_2108._8_8_ ^ local_2128._8_8_;
  auVar10._0_8_ = local_2108._0_8_ ^ local_2128._0_8_;
  auVar74 = aesdec(auVar10,auVar1);
  auVar1 = vpaddq_avx(auVar71,auVar73);
  local_20e8._0_8_ = auVar79._0_8_;
  local_20e8._8_8_ = auVar79._8_8_;
  local_2118._0_8_ = auVar1._0_8_;
  local_2118._8_8_ = auVar1._8_8_;
  auVar9._8_8_ = local_20d8._8_8_ ^ local_20e8._8_8_;
  auVar9._0_8_ = local_20d8._0_8_ ^ local_20e8._0_8_;
  auVar71 = aesdec(auVar9,auVar1);
  auVar1 = vpaddq_avx(auVar79,auVar73);
  local_2138._0_8_ = auVar75._0_8_;
  local_2138._8_8_ = auVar75._8_8_;
  local_20e8._0_8_ = auVar1._0_8_;
  local_20e8._8_8_ = auVar1._8_8_;
  auVar8._8_8_ = local_2118._8_8_ ^ local_2138._8_8_;
  auVar8._0_8_ = local_2118._0_8_ ^ local_2138._0_8_;
  auVar80 = aesdec(auVar8,auVar1);
  auVar1 = vpaddq_avx(auVar73,auVar75);
  local_20f8._0_8_ = auVar72._0_8_;
  local_20f8._8_8_ = auVar72._8_8_;
  local_2128._0_8_ = auVar1._0_8_;
  local_2128._8_8_ = auVar1._8_8_;
  auVar7._8_8_ = local_20e8._8_8_ ^ local_20f8._8_8_;
  auVar7._0_8_ = local_20e8._0_8_ ^ local_20f8._0_8_;
  auVar79 = aesdec(auVar7,auVar1);
  auVar1 = vpaddq_avx(auVar72,auVar75);
  local_20c8._0_8_ = auVar78._0_8_;
  local_20c8._8_8_ = auVar78._8_8_;
  local_20f8._0_8_ = auVar1._0_8_;
  local_20f8._8_8_ = auVar1._8_8_;
  auVar6._8_8_ = local_2128._8_8_ ^ local_20c8._8_8_;
  auVar6._0_8_ = local_2128._0_8_ ^ local_20c8._0_8_;
  auVar72 = aesdec(auVar6,auVar1);
  auVar1 = vpaddq_avx(auVar75,auVar78);
  local_2108._0_8_ = auVar74._0_8_;
  local_2108._8_8_ = auVar74._8_8_;
  local_2138._0_8_ = auVar1._0_8_;
  local_2138._8_8_ = auVar1._8_8_;
  auVar5._8_8_ = local_20f8._8_8_ ^ local_2108._8_8_;
  auVar5._0_8_ = local_20f8._0_8_ ^ local_2108._0_8_;
  auVar73 = aesdec(auVar5,auVar1);
  auVar1 = vpaddq_avx(auVar74,auVar78);
  local_20d8._0_8_ = auVar71._0_8_;
  local_20d8._8_8_ = auVar71._8_8_;
  local_2108._0_8_ = auVar1._0_8_;
  local_2108._8_8_ = auVar1._8_8_;
  auVar4._8_8_ = local_2138._8_8_ ^ local_20d8._8_8_;
  auVar4._0_8_ = local_2138._0_8_ ^ local_20d8._0_8_;
  auVar74 = aesdec(auVar4,auVar1);
  auVar1 = vpaddq_avx(auVar78,auVar71);
  local_2118._0_8_ = auVar80._0_8_;
  local_2118._8_8_ = auVar80._8_8_;
  auVar1 = vpaddq_avx(auVar1,auVar79);
  auVar78 = vpaddq_avx(auVar71,auVar73);
  auVar68._8_8_ = local_2108._8_8_ ^ local_2118._8_8_;
  auVar68._0_8_ = local_2108._0_8_ ^ local_2118._0_8_;
  auVar79 = vpaddq_avx(auVar68,auVar72);
  auVar71 = vpaddq_avx(auVar80,auVar74);
  local_20c8._0_8_ = auVar1._0_8_;
  local_20c8._8_8_ = auVar1._8_8_;
  local_20d8._0_8_ = auVar78._0_8_;
  local_20d8._8_8_ = auVar78._8_8_;
  local_2108._0_8_ = auVar79._0_8_;
  local_2108._8_8_ = auVar79._8_8_;
  local_2118._0_8_ = auVar71._0_8_;
  local_2118._8_8_ = auVar71._8_8_;
  auVar67._8_8_ = local_20c8._8_8_ ^ local_20d8._8_8_;
  auVar67._0_8_ = local_20c8._0_8_ ^ local_20d8._0_8_;
  auVar66._8_8_ = local_2108._8_8_ ^ local_2118._8_8_;
  auVar66._0_8_ = local_2108._0_8_ ^ local_2118._0_8_;
  vpaddq_avx(auVar67,auVar66);
  alVar81[1] = (longlong)in_RDX;
  alVar81[0] = uVar70;
  return alVar81;
}

Assistant:

static meow_u128
MeowHash(void *Seed128Init, meow_umm Len, void *SourceInit)
{
    meow_u128 xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7; // NOTE(casey): xmm0-xmm7 are the hash accumulation lanes
    meow_u128 xmm8, xmm9, xmm10, xmm11, xmm12, xmm13, xmm14, xmm15; // NOTE(casey): xmm8-xmm15 hold values to be appended (residual, length)
    
    meow_u8 *rax = (meow_u8 *)SourceInit;
    meow_u8 *rcx = (meow_u8 *)Seed128Init;
    
    //
	// NOTE(casey): Seed the eight hash registers
    //
    
    movdqu(xmm0, rcx + 0x00);
    movdqu(xmm1, rcx + 0x10);
    movdqu(xmm2, rcx + 0x20);
    movdqu(xmm3, rcx + 0x30);
    
    movdqu(xmm4, rcx + 0x40);
    movdqu(xmm5, rcx + 0x50);
    movdqu(xmm6, rcx + 0x60);
    movdqu(xmm7, rcx + 0x70);
    
    MEOW_DUMP_STATE("Seed", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    //
    // NOTE(casey): Hash all full 256-byte blocks
    //
    
    meow_umm BlockCount = (Len >> 8);
    if(BlockCount > MEOW_PREFETCH_LIMIT)
    {
        // NOTE(casey): For large input, modern Intel x64's can't hit full speed without prefetching, so we use this loop
        while(BlockCount--)
        {
            prefetcht0(rax + MEOW_PREFETCH + 0x00);
            prefetcht0(rax + MEOW_PREFETCH + 0x40);
            prefetcht0(rax + MEOW_PREFETCH + 0x80);
            prefetcht0(rax + MEOW_PREFETCH + 0xc0);
            
            MEOW_MIX(xmm0,xmm4,xmm6,xmm1,xmm2, rax + 0x00);
            MEOW_MIX(xmm1,xmm5,xmm7,xmm2,xmm3, rax + 0x20);
            MEOW_MIX(xmm2,xmm6,xmm0,xmm3,xmm4, rax + 0x40);
            MEOW_MIX(xmm3,xmm7,xmm1,xmm4,xmm5, rax + 0x60);
            MEOW_MIX(xmm4,xmm0,xmm2,xmm5,xmm6, rax + 0x80);
            MEOW_MIX(xmm5,xmm1,xmm3,xmm6,xmm7, rax + 0xa0);
            MEOW_MIX(xmm6,xmm2,xmm4,xmm7,xmm0, rax + 0xc0);
            MEOW_MIX(xmm7,xmm3,xmm5,xmm0,xmm1, rax + 0xe0);
            
            rax += 0x100;
        }
    }
    else
    {
        // NOTE(casey): For small input, modern Intel x64's can't hit full speed _with_ prefetching (because of port pressure), so we use this loop.
        while(BlockCount--)
        {
            MEOW_MIX(xmm0,xmm4,xmm6,xmm1,xmm2, rax + 0x00);
            MEOW_MIX(xmm1,xmm5,xmm7,xmm2,xmm3, rax + 0x20);
            MEOW_MIX(xmm2,xmm6,xmm0,xmm3,xmm4, rax + 0x40);
            MEOW_MIX(xmm3,xmm7,xmm1,xmm4,xmm5, rax + 0x60);
            MEOW_MIX(xmm4,xmm0,xmm2,xmm5,xmm6, rax + 0x80);
            MEOW_MIX(xmm5,xmm1,xmm3,xmm6,xmm7, rax + 0xa0);
            MEOW_MIX(xmm6,xmm2,xmm4,xmm7,xmm0, rax + 0xc0);
            MEOW_MIX(xmm7,xmm3,xmm5,xmm0,xmm1, rax + 0xe0);
            
            rax += 0x100;
        }
    }
    
    MEOW_DUMP_STATE("PostBlocks", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    //
    // NOTE(casey): Load any less-than-32-byte residual
    //
    
    pxor_clear(xmm9, xmm9);
    pxor_clear(xmm11, xmm11);
    
    //
    // TODO(casey): I need to put more thought into how the end-of-buffer stuff is actually working out here,
    // because I _think_ it may be possible to remove the first branch (on Len8) and let the mask zero out the
    // result, but it would take a little thought to make sure it couldn't read off the end of the buffer due
    // to the & 0xf on the align computation.
    //
    
    // NOTE(casey): First, we have to load the part that is _not_ 16-byte aligned
    meow_u8 *Last = (meow_u8 *)SourceInit + (Len & ~0xf);
    int unsigned Len8 = (Len & 0xf);
    if(Len8)
    {
        // NOTE(casey): Load the mask early
        movdqu(xmm8, &MeowMaskLen[0x10 - Len8]);
        
        meow_u8 *LastOk = (meow_u8*)((((meow_umm)(((meow_u8 *)SourceInit)+Len - 1)) | (MEOW_PAGESIZE - 1)) - 16);
        int Align = (Last > LastOk) ? ((int)(meow_umm)Last) & 0xf : 0;
        movdqu(xmm10, &MeowShiftAdjust[Align]);
        movdqu(xmm9, Last - Align);
        pshufb(xmm9, xmm10);
        
        // NOTE(jeffr): and off the extra bytes
        pand(xmm9, xmm8);
    }
    
    // NOTE(casey): Next, we have to load the part that _is_ 16-byte aligned
    if(Len & 0x10)
    {
        xmm11 = xmm9;
        movdqu(xmm9, Last - 0x10);
    }
    
    //
    // NOTE(casey): Construct the residual and length injests
    //
    
    xmm8 = xmm9;
    xmm10 = xmm9;
    palignr(xmm8, xmm11, 15);
    palignr(xmm10, xmm11, 1);
    
    // NOTE(casey): We have room for a 128-bit nonce and a 64-bit none here, but
    // the decision was made to leave them zero'd so as not to confuse people
    // about hwo to use them or what security implications they had.
    pxor_clear(xmm12, xmm12);
    pxor_clear(xmm13, xmm13);
    pxor_clear(xmm14, xmm14);
    movq(xmm15, Len);
    palignr(xmm12, xmm15, 15);
    palignr(xmm14, xmm15, 1);
    
    MEOW_DUMP_STATE("Residuals", xmm8, xmm9, xmm10, xmm11, xmm12, xmm13, xmm14, xmm15, 0);
    
    // NOTE(casey): To maintain the mix-down pattern, we always Meow Mix the less-than-32-byte residual, even if it was empty
    MEOW_MIX_REG(xmm0, xmm4, xmm6, xmm1, xmm2,  xmm8, xmm9, xmm10, xmm11);
    
    // NOTE(casey): Append the length, to avoid problems with our 32-byte padding
    MEOW_MIX_REG(xmm1, xmm5, xmm7, xmm2, xmm3,  xmm12, xmm13, xmm14, xmm15);
    
    MEOW_DUMP_STATE("PostAppend", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    //
    // NOTE(casey): Hash all full 32-byte blocks
    //
    int unsigned LaneCount = (Len >> 5) & 0x7;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm2,xmm6,xmm0,xmm3,xmm4, rax + 0x00); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm3,xmm7,xmm1,xmm4,xmm5, rax + 0x20); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm4,xmm0,xmm2,xmm5,xmm6, rax + 0x40); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm5,xmm1,xmm3,xmm6,xmm7, rax + 0x60); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm6,xmm2,xmm4,xmm7,xmm0, rax + 0x80); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm7,xmm3,xmm5,xmm0,xmm1, rax + 0xa0); --LaneCount;
    if(LaneCount == 0) goto MixDown; MEOW_MIX(xmm0,xmm4,xmm6,xmm1,xmm2, rax + 0xc0); --LaneCount;
    
    //
    // NOTE(casey): Mix the eight lanes down to one 128-bit hash
    //
    
    MixDown:
    
    MEOW_DUMP_STATE("PostLanes", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    MEOW_SHUFFLE(xmm0, xmm1, xmm2, xmm4, xmm5, xmm6);
    MEOW_SHUFFLE(xmm1, xmm2, xmm3, xmm5, xmm6, xmm7);
    MEOW_SHUFFLE(xmm2, xmm3, xmm4, xmm6, xmm7, xmm0);
    MEOW_SHUFFLE(xmm3, xmm4, xmm5, xmm7, xmm0, xmm1);
    MEOW_SHUFFLE(xmm4, xmm5, xmm6, xmm0, xmm1, xmm2);
    MEOW_SHUFFLE(xmm5, xmm6, xmm7, xmm1, xmm2, xmm3);
    MEOW_SHUFFLE(xmm6, xmm7, xmm0, xmm2, xmm3, xmm4);
    MEOW_SHUFFLE(xmm7, xmm0, xmm1, xmm3, xmm4, xmm5);
    MEOW_SHUFFLE(xmm0, xmm1, xmm2, xmm4, xmm5, xmm6);
    MEOW_SHUFFLE(xmm1, xmm2, xmm3, xmm5, xmm6, xmm7);
    MEOW_SHUFFLE(xmm2, xmm3, xmm4, xmm6, xmm7, xmm0);
    MEOW_SHUFFLE(xmm3, xmm4, xmm5, xmm7, xmm0, xmm1);
    
    MEOW_DUMP_STATE("PostMix", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    paddq(xmm0, xmm2);
    paddq(xmm1, xmm3);
    paddq(xmm4, xmm6);
    paddq(xmm5, xmm7);
    pxor(xmm0, xmm1);
    pxor(xmm4, xmm5);
    paddq(xmm0, xmm4);
    
    MEOW_DUMP_STATE("PostFold", xmm0, xmm1, xmm2, xmm3, xmm4, xmm5, xmm6, xmm7, 0);
    
    return(xmm0);
}